

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O1

void __thiscall Hpipe::Pool<Hpipe::CharItem,_32>::~Pool(Pool<Hpipe::CharItem,_32> *this)

{
  Set *pSVar1;
  void *pvVar2;
  Set *pSVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  
  if (this->last != (Set *)0x0) {
    lVar4 = (long)this->used;
    if (lVar4 != 0) {
      lVar5 = lVar4 * 0x88 + -0x20;
      do {
        pSVar1 = this->last;
        if ((long *)(pSVar1->items + lVar5) != *(long **)(pSVar1->items + lVar5 + -0x10)) {
          operator_delete(*(long **)(pSVar1->items + lVar5 + -0x10),
                          *(long *)(pSVar1->items + lVar5) + 1);
        }
        pvVar2 = *(void **)(pSVar1->items + lVar5 + -0x48);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)(pSVar1->items + lVar5 + -0x38) - (long)pvVar2);
        }
        pvVar2 = *(void **)(pSVar1->items + lVar5 + -0x60);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)(pSVar1->items + lVar5 + -0x50) - (long)pvVar2);
        }
        lVar4 = lVar4 + -1;
        lVar5 = lVar5 + -0x88;
      } while (lVar4 != 0);
    }
    pSVar1 = this->last;
    pSVar3 = pSVar1->prev;
    if (pSVar1 != (Set *)0x0) {
      operator_delete(pSVar1,0x1108);
    }
    while (pSVar3 != (Set *)0x0) {
      pSVar1 = pSVar3->prev;
      pcVar6 = pSVar3->items + 0x10e0;
      lVar4 = -0x20;
      do {
        if ((long *)pcVar6 != *(long **)(pcVar6 + -0x10)) {
          operator_delete(*(long **)(pcVar6 + -0x10),*(long *)pcVar6 + 1);
        }
        pvVar2 = *(void **)(pcVar6 + -0x48);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)(pcVar6 + -0x38) - (long)pvVar2);
        }
        pvVar2 = *(void **)(pcVar6 + -0x60);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)(pcVar6 + -0x50) - (long)pvVar2);
        }
        pcVar6 = pcVar6 + -0x88;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
      operator_delete(pSVar3,0x1108);
      pSVar3 = pSVar1;
    }
  }
  return;
}

Assistant:

~Pool() {
        if ( last ) {
            // delete the last
            for( int i = used; i--; )
                reinterpret_cast<T *>( last->items + sizeof( T ) * i )->~T();

            // previous items
            Set *c = last->prev;
            delete last;
            while( c ) {
                Set *p = c->prev;
                for( int i = s; i--; )
                    reinterpret_cast<T *>( c->items + sizeof( T ) * i )->~T();
                delete c;
                c = p;
            }
        }
    }